

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::ArrayFeatureType::ByteSizeLong(ArrayFeatureType *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong *puVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  
  uVar4 = (this->shape_).current_size_;
  uVar7 = 0;
  if ((int)uVar4 < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar5 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->shape_,(int)uVar7);
      lVar3 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      uVar9 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar9;
    } while (uVar4 != uVar9);
    if (lVar8 == 0) {
      lVar8 = 0;
      uVar7 = 0;
    }
    else if ((int)(uint)lVar8 < 0) {
      uVar7 = 0xb;
    }
    else {
      uVar4 = (uint)lVar8 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_shape_cached_byte_size_ = (int)lVar8;
  sVar10 = uVar7 + lVar8;
  uVar4 = this->datatype_;
  if (uVar4 != 0) {
    if ((int)uVar4 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar10 = sVar10 + uVar7;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    sVar6 = ArrayFeatureType_ShapeRange::ByteSizeLong((this->ShapeFlexibility_).shaperange_);
  }
  else {
    if (this->_oneof_case_[0] != 0x15) goto LAB_001c9940;
    sVar6 = ArrayFeatureType_EnumeratedShapes::ByteSizeLong
                      ((this->ShapeFlexibility_).enumeratedshapes_);
  }
  uVar4 = (uint)sVar6 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar10 = sVar10 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
LAB_001c9940:
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0x3d) {
    sVar10 = sVar10 + 10;
  }
  else if (uVar1 == 0x33) {
    sVar10 = sVar10 + 6;
  }
  else if (uVar1 == 0x29) {
    if ((this->defaultOptionalValue_).intdefaultvalue_ < 0) {
      uVar7 = 0xc;
    }
    else {
      uVar4 = (this->defaultOptionalValue_).intdefaultvalue_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
    }
    sVar10 = sVar10 + uVar7;
  }
  this->_cached_size_ = (int)sVar10;
  return sVar10;
}

Assistant:

size_t ArrayFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ArrayFeatureType)
  size_t total_size = 0;

  // repeated int64 shape = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->shape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _shape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->datatype() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->datatype());
  }

  switch (ShapeFlexibility_case()) {
    // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
    case kEnumeratedShapes: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.enumeratedshapes_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
    case kShapeRange: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.shaperange_);
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (defaultOptionalValue_case()) {
    // int32 intDefaultValue = 41;
    case kIntDefaultValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->intdefaultvalue());
      break;
    }
    // float floatDefaultValue = 51;
    case kFloatDefaultValue: {
      total_size += 2 + 4;
      break;
    }
    // double doubleDefaultValue = 61;
    case kDoubleDefaultValue: {
      total_size += 2 + 8;
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}